

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patomic-sync.c
# Opt level: O3

pboolean p_atomic_pointer_compare_and_exchange(void *atomic,ppointer oldval,ppointer newval)

{
  ppointer pvVar1;
  
  LOCK();
  pvVar1 = *atomic;
  if (oldval == pvVar1) {
    *(ppointer *)atomic = newval;
  }
  UNLOCK();
  return (pboolean)(oldval == pvVar1);
}

Assistant:

P_LIB_API pboolean
p_atomic_pointer_compare_and_exchange (volatile void	*atomic,
				       ppointer		oldval,
				       ppointer		newval)
{
#ifdef P_CC_CRAY
	return __sync_val_compare_and_swap ((volatile psize *) atomic,
					    (psize) oldval,
					    (psize) newval) == ((psize) oldval) ? TRUE : FALSE;
#else
	return (pboolean) __sync_bool_compare_and_swap ((volatile psize *) atomic,
							(psize) oldval,
							(psize) newval);
#endif
}